

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

void luaG_runerror(lua_State *L,char *fmt,...)

{
  CallInfo *ci_00;
  TString *src;
  long lVar1;
  long lVar2;
  char in_AL;
  int line;
  char *msg_00;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  Value *local_58;
  TValue *io2;
  TValue *io1;
  va_list argp;
  char *msg;
  CallInfo *ci;
  char *fmt_local;
  lua_State *L_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  ci_00 = L->ci;
  local_f8 = in_RDX;
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  if (L->l_G->GCdebt < 1) {
    luaC_step(L);
  }
  argp[0].overflow_arg_area = local_108;
  argp[0]._0_8_ = &stack0x00000008;
  io1._4_4_ = 0x30;
  io1._0_4_ = 0x10;
  msg_00 = luaO_pushvfstring(L,fmt,(__va_list_tag *)&io1);
  if (msg_00 == (char *)0x0) {
    luaD_throw(L,'\x04');
  }
  if ((ci_00->callstatus & 0x8000) == 0) {
    src = *(TString **)(*(long *)((((ci_00->func).p)->val).value_.f + 0x18) + 0x70);
    line = getcurrentline(ci_00);
    luaG_addinfo(L,msg_00,src,line);
    lVar1 = (L->top).offset;
    io2 = (TValue *)(lVar1 + -0x20);
    lVar2 = (L->top).offset;
    local_58 = (Value *)(lVar2 + -0x10);
    io2->value_ = *local_58;
    *(undefined1 *)(lVar1 + -0x18) = *(undefined1 *)(lVar2 + -8);
    (L->top).p = (StkId)((L->top).offset + -0x10);
  }
  luaG_errormsg(L);
}

Assistant:

l_noret luaG_runerror (lua_State *L, const char *fmt, ...) {
  CallInfo *ci = L->ci;
  const char *msg;
  va_list argp;
  luaC_checkGC(L);  /* error message uses memory */
  va_start(argp, fmt);
  msg = luaO_pushvfstring(L, fmt, argp);  /* format message */
  va_end(argp);
  if (msg == NULL)  /* no memory to format message? */
    luaD_throw(L, LUA_ERRMEM);
  else if (isLua(ci)) {  /* Lua function? */
    /* add source:line information */
    luaG_addinfo(L, msg, ci_func(ci)->p->source, getcurrentline(ci));
    setobjs2s(L, L->top.p - 2, L->top.p - 1);  /* remove 'msg' */
    L->top.p--;
  }
  luaG_errormsg(L);
}